

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

DImpactDecal *
DImpactDecal::StaticCreate
          (FDecalTemplate *tpl,DVector3 *pos,side_t *wall,F3DFloor *ffloor,PalEntry color)

{
  FDecalTemplate *tpl_00;
  DImpactDecal *ffloor_00;
  F3DFloor *wall_00;
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  DBaseDecal *this;
  FTextureID local_68 [5];
  anon_union_4_2_12391d7c_for_PalEntry_0 local_54;
  FDecalTemplate *local_50;
  FDecalTemplate *tpl_low;
  DBaseDecal *pDStack_40;
  int lowercolor;
  DImpactDecal *decal;
  F3DFloor *ffloor_local;
  side_t *wall_local;
  DVector3 *pos_local;
  FDecalTemplate *tpl_local;
  PalEntry color_local;
  
  pDStack_40 = (DBaseDecal *)0x0;
  if (((tpl != (FDecalTemplate *)0x0) &&
      (decal = (DImpactDecal *)ffloor, ffloor_local = (F3DFloor *)wall, wall_local = (side_t *)pos,
      pos_local = (DVector3 *)tpl, tpl_local._4_4_ = color.field_0,
      iVar2 = FIntCVar::operator_cast_to_int(&cl_maxdecals), 0 < iVar2)) &&
     ((ffloor_local[1].bottom.vindex & 2) == 0)) {
    if (pos_local[4].Y != 0.0) {
      local_50 = (FDecalTemplate *)(*(code *)**(undefined8 **)pos_local[4].Y)();
      if (*(DWORD *)&pos_local[2].Z == local_50->ShadeColor) {
        tpl_low._4_4_ = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&tpl_local + 4));
      }
      else {
        tpl_low._4_4_ = 0;
      }
      pos = (DVector3 *)wall_local;
      wall_00 = ffloor_local;
      ffloor_00 = decal;
      tpl_00 = local_50;
      PalEntry::PalEntry((PalEntry *)&local_54.field_0,tpl_low._4_4_);
      StaticCreate(tpl_00,pos,(side_t *)wall_00,(F3DFloor *)ffloor_00,(PalEntry)local_54);
    }
    CheckMax();
    this = (DBaseDecal *)DObject::operator_new((DObject *)0x98,(size_t)pos);
    DImpactDecal((DImpactDecal *)this,wall_local->textures[0].xOffset);
    if (this == (DBaseDecal *)0x0) {
      return (DImpactDecal *)0x0;
    }
    pDStack_40 = this;
    local_68[0] = DBaseDecal::StickToWall
                            (this,(side_t *)ffloor_local,(double)wall_local->sector,
                             (double)wall_local->AttachedDecals,(F3DFloor *)decal);
    bVar1 = FTextureID::isValid(local_68);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return (DImpactDecal *)0x0;
    }
    FDecalTemplate::ApplyToDecal((FDecalTemplate *)pos_local,pDStack_40,(side_t *)ffloor_local);
    uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&tpl_local + 4));
    if (uVar3 != 0) {
      DBaseDecal::SetShade
                (pDStack_40,tpl_local._4_4_ >> 0x10 & 0xff,tpl_local._4_4_ >> 8 & 0xff,
                 tpl_local._4_4_ & 0xff);
    }
    bVar1 = FBoolCVar::operator_cast_to_bool(&cl_spreaddecals);
    if ((!bVar1) || (bVar1 = FTextureID::isValid(&pDStack_40->PicNum), !bVar1)) {
      return (DImpactDecal *)pDStack_40;
    }
    DBaseDecal::Spread(pDStack_40,(FDecalTemplate *)pos_local,(side_t *)ffloor_local,
                       (double)wall_local->sector,(double)wall_local->AttachedDecals,
                       wall_local->textures[0].xOffset,(F3DFloor *)decal);
  }
  return (DImpactDecal *)pDStack_40;
}

Assistant:

DImpactDecal *DImpactDecal::StaticCreate (const FDecalTemplate *tpl, const DVector3 &pos, side_t *wall, F3DFloor * ffloor, PalEntry color)
{
	DImpactDecal *decal = NULL;
	if (tpl != NULL && cl_maxdecals > 0 && !(wall->Flags & WALLF_NOAUTODECALS))
	{
		if (tpl->LowerDecal)
		{
			int lowercolor;
			const FDecalTemplate * tpl_low = tpl->LowerDecal->GetDecal();

			// If the default color of the lower decal is the same as the main decal's
			// apply the custom color as well.
			if (tpl->ShadeColor != tpl_low->ShadeColor) lowercolor=0;
			else lowercolor = color;
			StaticCreate (tpl_low, pos, wall, ffloor, lowercolor);
		}
		DImpactDecal::CheckMax();
		decal = new DImpactDecal (pos.Z);
		if (decal == NULL)
		{
			return NULL;
		}

		if (!decal->StickToWall (wall, pos.X, pos.Y, ffloor).isValid())
		{
			return NULL;
		}

		tpl->ApplyToDecal (decal, wall);
		if (color != 0)
		{
			decal->SetShade (color.r, color.g, color.b);
		}

		if (!cl_spreaddecals || !decal->PicNum.isValid())
		{
			return decal;
		}

		// Spread decal to nearby walls if it does not all fit on this one
		decal->Spread (tpl, wall, pos.X, pos.Y, pos.Z, ffloor);
	}
	return decal;
}